

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O3

void __thiscall Automaton::buildReads(Automaton *this)

{
  Repository *pRVar1;
  ReadNode RVar2;
  
  buildDirectReads(this);
  buildReadsDigraph(this);
  this->_M_reads_dfn = 0;
  pRVar1 = Node<Read>::repository();
  RVar2._M_node = (pRVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pRVar1 = Node<Read>::repository();
    if ((_Rb_tree_header *)RVar2._M_node == &(pRVar1->_M_t)._M_impl.super__Rb_tree_header) break;
    if ((char)RVar2._M_node[1]._M_color == _S_black) {
      visitReadNode(this,RVar2);
    }
    RVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(RVar2._M_node);
  }
  pRVar1 = Node<Read>::repository();
  RVar2._M_node = (pRVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    pRVar1 = Node<Read>::repository();
    if ((_Rb_tree_header *)RVar2._M_node == &(pRVar1->_M_t)._M_impl.super__Rb_tree_header) break;
    visitReadNode(this,RVar2);
    RVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(RVar2._M_node);
  }
  return;
}

Assistant:

void Automaton::buildReads ()
{
  buildDirectReads ();
  buildReadsDigraph ();

  _M_reads_dfn = 0;

  for (ReadsGraph::iterator node = ReadsGraph::begin_nodes (); node != ReadsGraph::end_nodes (); ++node)
    {
      if (! node->root)
        continue;

      visitReadNode (node);
    }

  for (ReadsGraph::iterator node = ReadsGraph::begin_nodes (); node != ReadsGraph::end_nodes (); ++node)
    visitReadNode (node);
}